

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O1

int property_set(char *key,char *value)

{
  size_t sVar1;
  ssize_t sVar2;
  int iVar3;
  char recvBuf [1];
  char sendBuf [125];
  char local_99;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined5 uStack_30;
  undefined3 local_2b;
  undefined5 uStack_28;
  undefined8 uStack_23;
  
  pthread_once(&gInitOnce,init);
  iVar3 = -1;
  if (-1 < gPropFd) {
    sVar1 = strlen(key);
    if (sVar1 < 0x20) {
      sVar1 = strlen(value);
      if (sVar1 < 0x5c) {
        uStack_90 = 0xdddddddddddddddd;
        uStack_28 = 0xdddddddddd;
        uStack_23 = 0xdddddddddddddddd;
        uStack_38 = 0xdddddddddddddddd;
        uStack_30 = 0xdddddddddd;
        local_2b = 0xdddddd;
        local_48 = 0xdddddddddddddddd;
        uStack_40 = 0xdddddddddddddddd;
        local_58 = 0xdddddddddddddddd;
        uStack_50 = 0xdddddddddddddddd;
        local_68 = 0xdddddddddddddddd;
        uStack_60 = 0xdddddddddddddddd;
        local_78 = 0xdddddddddddddddd;
        uStack_70 = 0xdddddddddddddddd;
        local_88 = 0xdddddddddddddddd;
        uStack_80 = 0xdddddddddddddddd;
        local_98 = 0xdddddddddddddd02;
        strcpy((char *)((long)&local_98 + 1),key);
        strcpy((char *)((long)&local_78 + 1),value);
        pthread_mutex_lock((pthread_mutex_t *)&gPropertyFdLock);
        sVar2 = write(gPropFd,&local_98,0x7d);
        if (sVar2 == 0x7d) {
          sVar2 = read(gPropFd,&local_99,1);
          pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
          if (sVar2 == 1) {
            iVar3 = -(uint)(local_99 != '\x01');
          }
        }
        else {
          pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int property_set(const char *key, const char *value)
{
    char sendBuf[1+PROPERTY_KEY_MAX+PROPERTY_VALUE_MAX];
    char recvBuf[1];
    int result = -1;

    //LOGV("PROPERTY SET [%s]: [%s]\n", key, value);

    pthread_once(&gInitOnce, init);
    if (gPropFd < 0)
        return -1;

    if (strlen(key) >= PROPERTY_KEY_MAX) return -1;
    if (strlen(value) >= PROPERTY_VALUE_MAX) return -1;

    memset(sendBuf, 0xdd, sizeof(sendBuf));    // placate valgrind

    sendBuf[0] = (char) kSystemPropertySet;
    strcpy(sendBuf+1, key);
    strcpy(sendBuf+1+PROPERTY_KEY_MAX, value);

    pthread_mutex_lock(&gPropertyFdLock);
    if (write(gPropFd, sendBuf, sizeof(sendBuf)) != sizeof(sendBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    if (read(gPropFd, recvBuf, sizeof(recvBuf)) != sizeof(recvBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    pthread_mutex_unlock(&gPropertyFdLock);

    if (recvBuf[0] != 1)
        return -1;
    return 0;
}